

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_math.hpp
# Opt level: O1

double __thiscall
trng::int_math::power<2147483647,_123567893>::pow
          (power<2147483647,_123567893> *this,double __x,double __y)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint in_ESI;
  long lVar5;
  
  if (0 < (int)in_ESI) {
    lVar2 = 1;
    lVar4 = 0x75d7f15;
    do {
      if ((in_ESI & 1) != 0) {
        lVar3 = ((ulong)(lVar2 * lVar4) >> 0x1f) + (ulong)((uint)(lVar2 * lVar4) & 0x7fffffff);
        lVar5 = lVar3 << 0x20;
        lVar2 = lVar5 + -0x7fffffff00000000;
        if ((uint)lVar3 < 0x7fffffff) {
          lVar2 = lVar5;
        }
        lVar2 = lVar2 >> 0x20;
      }
      lVar3 = ((ulong)(lVar4 * lVar4) >> 0x1f) + (ulong)((uint)(lVar4 * lVar4) & 0x7ffffffd);
      lVar5 = lVar3 << 0x20;
      lVar4 = lVar5 + -0x7fffffff00000000;
      if ((uint)lVar3 < 0x7fffffff) {
        lVar4 = lVar5;
      }
      lVar4 = lVar4 >> 0x20;
      bVar1 = 1 < in_ESI;
      in_ESI = in_ESI >> 1;
    } while (bVar1);
    return __x;
  }
  return __x;
}

Assistant:

int32_t pow(int32_t n) {
        int64_t p{1}, t{b};
        while (n > 0) {
          if ((n & 0x1) == 0x1)
            p = modulo<m, 1>(p * t);
          t = modulo<m, 1>(t * t);
          n /= 2;
        }
        return static_cast<int32_t>(p);
      }